

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall spoa::Graph::TopologicalSort(Graph *this)

{
  uint uVar1;
  pointer ppNVar2;
  Node *pNVar3;
  pointer ppEVar4;
  Node **ppNVar5;
  value_type *ppNVar6;
  bool bVar7;
  pointer puVar8;
  _Elt_pointer ppNVar9;
  Edge **jt;
  pointer ppEVar10;
  Node **jt_1;
  Node **__args;
  value_type *__x;
  reference rVar11;
  value_type curr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> marks;
  stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
  stack;
  vector<bool,_std::allocator<bool>_> ignored;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> local_e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  Graph *local_c0;
  pointer local_b8;
  pointer local_b0;
  _Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> local_a8;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  ppNVar2 = (this->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->rank_to_node_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar2) {
    (this->rank_to_node_).
    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar2;
  }
  local_a8._M_impl.super__Deque_impl_data._M_map._0_1_ =
       (deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type_conflict4 *)&local_a8,
             (allocator_type *)&local_58);
  local_a8._M_impl.super__Deque_impl_data._M_map._0_1_ =
       (deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_a8,
             (allocator_type *)&local_e0);
  std::stack<spoa::Graph::Node*,std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>>::
  stack<std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>,void>
            ((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
              *)&local_a8);
  local_b8 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  puVar8 = (this->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c0 = this;
  while( true ) {
    if (puVar8 == local_b8) {
      bVar7 = IsTopologicallySorted(local_c0);
      if (bVar7) {
        std::_Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::~_Deque_base
                  (&local_a8);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
        return;
      }
      __assert_fail("IsTopologicallySorted() && \"Graph is not topologically sorted\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp",
                    0x12e,"void spoa::Graph::TopologicalSort()");
    }
    pNVar3 = (puVar8->_M_t).
             super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
             super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
             super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
    local_b0 = puVar8;
    if (local_d8._M_impl.super__Vector_impl_data._M_start[pNVar3->id] == '\0') break;
LAB_001111e2:
    puVar8 = local_b0 + 1;
  }
  local_e0._M_head_impl = pNVar3;
  std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
  emplace_back<spoa::Graph::Node*>
            ((deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&local_a8,
             &local_e0._M_head_impl);
LAB_001111ff:
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_001111e2;
  ppNVar9 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar9 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_e0._M_head_impl = ppNVar9[-1];
  if (local_d8._M_impl.super__Vector_impl_data._M_start[(local_e0._M_head_impl)->id] != '\x02') {
    ppEVar4 = ((local_e0._M_head_impl)->inedges).
              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar7 = true;
    for (ppEVar10 = ((local_e0._M_head_impl)->inedges).
                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar10 != ppEVar4;
        ppEVar10 = ppEVar10 + 1) {
      if (local_d8._M_impl.super__Vector_impl_data._M_start[(*ppEVar10)->tail->id] != '\x02') {
        std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::push_back
                  ((deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)&local_a8,
                   &(*ppEVar10)->tail);
        bVar7 = false;
      }
    }
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&local_58,
                        (ulong)(local_e0._M_head_impl)->id);
    if ((*rVar11._M_p & rVar11._M_mask) == 0) {
      ppNVar6 = ((local_e0._M_head_impl)->aligned_nodes).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (__x = ((local_e0._M_head_impl)->aligned_nodes).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; __x != ppNVar6; __x = __x + 1) {
        if (local_d8._M_impl.super__Vector_impl_data._M_start[(*__x)->id] != '\x02') {
          std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::push_back
                    ((deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)&local_a8,
                     __x);
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&local_58,(ulong)(*__x)->id);
          *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
          bVar7 = false;
        }
      }
    }
    uVar1 = (local_e0._M_head_impl)->id;
    if (!bVar7) {
      if (local_d8._M_impl.super__Vector_impl_data._M_start[uVar1] == '\x01') {
        __assert_fail("(is_valid || marks[curr->id] != 1) && \"Graph is not a DAG\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp"
                      ,0x119,"void spoa::Graph::TopologicalSort()");
      }
      local_d8._M_impl.super__Vector_impl_data._M_start[uVar1] = '\x01';
      goto LAB_001111ff;
    }
    local_d8._M_impl.super__Vector_impl_data._M_start[uVar1] = '\x02';
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&local_58,
                        (ulong)(local_e0._M_head_impl)->id);
    if ((*rVar11._M_p & rVar11._M_mask) == 0) {
      std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
      emplace_back<spoa::Graph::Node*&>
                ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                 &this->rank_to_node_,&local_e0._M_head_impl);
      ppNVar5 = ((local_e0._M_head_impl)->aligned_nodes).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (__args = ((local_e0._M_head_impl)->aligned_nodes).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; __args != ppNVar5; __args = __args + 1
          ) {
        std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
        emplace_back<spoa::Graph::Node*const&>
                  ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                   &this->rank_to_node_,__args);
      }
      if (bVar7) goto LAB_0011134f;
      goto LAB_001111ff;
    }
  }
LAB_0011134f:
  std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::pop_back
            ((deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)&local_a8);
  goto LAB_001111ff;
}

Assistant:

void Graph::TopologicalSort() {
  rank_to_node_.clear();

  std::vector<std::uint8_t> marks(nodes_.size(), 0);
  std::vector<bool> ignored(nodes_.size(), 0);

  std::stack<Node*> stack;
  for (const auto& it : nodes_) {
    if (marks[it->id] != 0) {
      continue;
    }
    stack.push(it.get());
    while (!stack.empty()) {
      auto curr = stack.top();
      bool is_valid = true;
      if (marks[curr->id] != 2) {
        for (const auto& jt : curr->inedges) {
          if (marks[jt->tail->id] != 2) {
            stack.push(jt->tail);
            is_valid = false;
          }
        }
        if (!ignored[curr->id]) {
          for (const auto& jt : curr->aligned_nodes) {
            if (marks[jt->id] != 2) {
              stack.push(jt);
              ignored[jt->id] = true;
              is_valid = false;
            }
          }
        }

        assert((is_valid || marks[curr->id] != 1) && "Graph is not a DAG");

        if (is_valid) {
          marks[curr->id] = 2;
          if (!ignored[curr->id]) {
            rank_to_node_.emplace_back(curr);
            for (const auto& jt : curr->aligned_nodes) {
              rank_to_node_.emplace_back(jt);
            }
          }
        } else {
          marks[curr->id] = 1;
        }
      }

      if (is_valid) {
        stack.pop();
      }
    }
  }

  assert(IsTopologicallySorted() && "Graph is not topologically sorted");
}